

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall mkvparser::Chapters::~Chapters(Chapters *this)

{
  Edition *pEVar1;
  uint uVar2;
  long lVar3;
  
  while( true ) {
    pEVar1 = this->m_editions;
    if (this->m_editions_count < 1) break;
    uVar2 = this->m_editions_count - 1;
    this->m_editions_count = uVar2;
    Edition::Clear(pEVar1 + uVar2);
  }
  if (pEVar1 != (Edition *)0x0) {
    lVar3._0_4_ = pEVar1[-1].m_atoms_size;
    lVar3._4_4_ = pEVar1[-1].m_atoms_count;
    if (lVar3 != 0) {
      lVar3 = lVar3 << 4;
      do {
        Edition::~Edition((Edition *)((long)&pEVar1[-1].m_atoms + lVar3));
        lVar3 = lVar3 + -0x10;
      } while (lVar3 != 0);
    }
    operator_delete__(&pEVar1[-1].m_atoms_size);
    return;
  }
  return;
}

Assistant:

Chapters::~Chapters() {
  while (m_editions_count > 0) {
    Edition& e = m_editions[--m_editions_count];
    e.Clear();
  }
  delete[] m_editions;
}